

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Node::DumpPropertiesBinary(Node *this,StreamWriterLE *s)

{
  bool bVar1;
  reference this_00;
  FBXExportProperty *p;
  iterator __end1;
  iterator __begin1;
  vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_> *__range1;
  StreamWriterLE *s_local;
  Node *this_local;
  
  __end1 = std::
           vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>::
           begin(&this->properties);
  p = (FBXExportProperty *)
      std::vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>::
      end(&this->properties);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Assimp::FBX::FBXExportProperty_*,_std::vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>_>
                                *)&p);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<Assimp::FBX::FBXExportProperty_*,_std::vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>_>
              ::operator*(&__end1);
    FBX::FBXExportProperty::DumpBinary(this_00,s);
    __gnu_cxx::
    __normal_iterator<Assimp::FBX::FBXExportProperty_*,_std::vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void FBX::Node::DumpPropertiesBinary(Assimp::StreamWriterLE& s)
{
    for (auto &p : properties) {
        p.DumpBinary(s);
    }
}